

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec2,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                eps2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int rn2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  fpclass_type fVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 ridx_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_00;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  bool bVar8;
  type_conflict5 tVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int j_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_448;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_440;
  int *local_438;
  int *local_430;
  int *local_428;
  int32_t local_41c;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_418;
  int *local_410;
  int j_1;
  ulong uStack_400;
  uint local_3f8 [2];
  uint auStack_3f0 [2];
  uint local_3e8 [2];
  uint auStack_3e0 [2];
  uint local_3d8 [2];
  uint auStack_3d0 [2];
  int local_3c8;
  bool local_3c4;
  undefined8 local_3c0;
  int *local_3b0;
  int j;
  uint auStack_3a0 [2];
  uint local_398 [2];
  uint auStack_390 [2];
  uint local_388 [2];
  uint auStack_380 [2];
  uint local_378 [2];
  uint auStack_370 [2];
  int local_368;
  bool local_364;
  undefined8 local_360;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
  local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
  local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
  local_88.m_backend.exp = (eps->m_backend).exp;
  local_88.m_backend.neg = (eps->m_backend).neg;
  local_88.m_backend.fpclass = (eps->m_backend).fpclass;
  local_88.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_d8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_d8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_d8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_d8.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_d8.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  local_d8.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x38);
  local_d8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x40);
  local_d8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x44);
  local_d8.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x48);
  local_448 = eps;
  vSolveLright2(this,rhs,ridx,&rn,&local_88,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._8_8_,(int *)eps2.m_backend.data._M_elems._16_8_,
                (int *)(eps2.m_backend.data._M_elems + 6),&local_d8);
  local_440 = vec;
  local_438 = idx;
  local_428 = ridx;
  local_418 = this;
  if (eps2.m_backend.data._M_elems._32_8_ == 0) {
    local_430 = (this->row).perm;
    _j_1 = _j_1 & 0xffffffff00000000;
    for (lVar11 = 0; lVar11 < rn; lVar11 = lVar11 + 1) {
      iVar2 = ridx[lVar11];
      local_2b8.m_backend.exp = rhs[iVar2].m_backend.exp;
      local_2b8.m_backend.neg = rhs[iVar2].m_backend.neg;
      local_2b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar2].m_backend.data._M_elems;
      local_2b8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(rhs[iVar2].m_backend.data._M_elems + 2);
      puVar1 = rhs[iVar2].m_backend.data._M_elems + 4;
      local_2b8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_2b8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs[iVar2].m_backend.data._M_elems + 8;
      local_2b8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_2b8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs[iVar2].m_backend.data._M_elems + 0xc;
      local_2b8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_2b8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_2b8.m_backend.fpclass = rhs[iVar2].m_backend.fpclass;
      local_2b8.m_backend.prec_elem = rhs[iVar2].m_backend.prec_elem;
      local_308.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_448->m_backend).data._M_elems;
      local_308.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_448->m_backend).data._M_elems + 2);
      local_308.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_448->m_backend).data._M_elems + 4);
      local_308.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_448->m_backend).data._M_elems + 6);
      local_308.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_448->m_backend).data._M_elems + 8);
      local_308.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((local_448->m_backend).data._M_elems + 10);
      local_308.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((local_448->m_backend).data._M_elems + 0xc);
      local_308.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((local_448->m_backend).data._M_elems + 0xe);
      local_308.m_backend.exp = (local_448->m_backend).exp;
      local_308.m_backend.neg = (local_448->m_backend).neg;
      local_308.m_backend.fpclass = (local_448->m_backend).fpclass;
      local_308.m_backend.prec_elem = (local_448->m_backend).prec_elem;
      bVar8 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_2b8,&local_308);
      if (bVar8) {
        enQueueMax(ridx,&j_1,local_430[iVar2]);
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (&rhs[iVar2].m_backend,0);
      }
    }
    rn = j_1;
  }
  else {
    local_410 = (int *)eps2.m_backend.data._M_elems._48_8_;
    local_3b0 = (this->row).perm;
    _j = _j & 0xffffffff00000000;
    for (lVar11 = 0; lVar11 < rn; lVar11 = lVar11 + 1) {
      iVar2 = local_428[lVar11];
      lVar12 = (long)iVar2;
      lVar10 = lVar12 * 0x50;
      _j_1 = *(ulong *)rhs[lVar12].m_backend.data._M_elems;
      uStack_400 = *(ulong *)(rhs[lVar12].m_backend.data._M_elems + 2);
      puVar1 = rhs[lVar12].m_backend.data._M_elems + 4;
      local_3f8 = *(uint (*) [2])puVar1;
      auStack_3f0 = *(uint (*) [2])(puVar1 + 2);
      puVar1 = rhs[lVar12].m_backend.data._M_elems + 8;
      local_3e8 = *(uint (*) [2])puVar1;
      auStack_3e0 = *(uint (*) [2])(puVar1 + 2);
      puVar1 = rhs[lVar12].m_backend.data._M_elems + 0xc;
      local_3d8 = *(uint (*) [2])puVar1;
      auStack_3d0 = *(uint (*) [2])(puVar1 + 2);
      iVar3 = rhs[lVar12].m_backend.exp;
      local_358.m_backend.neg = rhs[lVar12].m_backend.neg;
      fVar4 = rhs[lVar12].m_backend.fpclass;
      local_41c = rhs[lVar12].m_backend.prec_elem;
      local_358.m_backend.data._M_elems._0_8_ = *(undefined8 *)rhs[lVar12].m_backend.data._M_elems;
      local_358.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)(rhs[lVar12].m_backend.data._M_elems + 2);
      puVar1 = rhs[lVar12].m_backend.data._M_elems + 4;
      local_358.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_358.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs[lVar12].m_backend.data._M_elems + 8;
      local_358.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_358.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = rhs[lVar12].m_backend.data._M_elems + 0xc;
      local_358.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_358.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_430 = (int *)CONCAT71(local_430._1_7_,local_358.m_backend.neg);
      local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_448->m_backend).data._M_elems;
      local_268.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_448->m_backend).data._M_elems + 2);
      local_268.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_448->m_backend).data._M_elems + 4);
      local_268.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_448->m_backend).data._M_elems + 6);
      local_268.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_448->m_backend).data._M_elems + 8);
      local_268.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((local_448->m_backend).data._M_elems + 10);
      local_268.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((local_448->m_backend).data._M_elems + 0xc);
      local_268.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((local_448->m_backend).data._M_elems + 0xe);
      local_268.m_backend.exp = (local_448->m_backend).exp;
      local_268.m_backend.neg = (local_448->m_backend).neg;
      local_268.m_backend.fpclass = (local_448->m_backend).fpclass;
      local_268.m_backend.prec_elem = (local_448->m_backend).prec_elem;
      local_358.m_backend.exp = iVar3;
      local_358.m_backend.fpclass = fVar4;
      local_358.m_backend.prec_elem = local_41c;
      bVar8 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_358,&local_268);
      if (bVar8) {
        *local_410 = iVar2;
        local_410 = local_410 + 1;
        enQueueMax(local_428,&j,local_3b0[lVar12]);
        puVar1 = (uint *)(eps2.m_backend.data._M_elems._32_8_ + 0x30 + lVar10);
        *(uint (*) [2])puVar1 = local_3d8;
        *(uint (*) [2])(puVar1 + 2) = auStack_3d0;
        puVar1 = (uint *)(eps2.m_backend.data._M_elems._32_8_ + 0x20 + lVar10);
        *(uint (*) [2])puVar1 = local_3e8;
        *(uint (*) [2])(puVar1 + 2) = auStack_3e0;
        puVar1 = (uint *)(eps2.m_backend.data._M_elems._32_8_ + 0x10 + lVar10);
        *(uint (*) [2])puVar1 = local_3f8;
        *(uint (*) [2])(puVar1 + 2) = auStack_3f0;
        *(ulong *)(eps2.m_backend.data._M_elems._32_8_ + lVar10) = _j_1;
        ((ulong *)(eps2.m_backend.data._M_elems._32_8_ + lVar10))[1] = uStack_400;
        *(int *)(eps2.m_backend.data._M_elems._32_8_ + 0x40 + lVar10) = iVar3;
        *(undefined1 *)(eps2.m_backend.data._M_elems._32_8_ + 0x44 + lVar10) = local_430._0_1_;
        *(fpclass_type *)(eps2.m_backend.data._M_elems._32_8_ + 0x48 + lVar10) = fVar4;
        *(int32_t *)(eps2.m_backend.data._M_elems._32_8_ + 0x4c + lVar10) = local_41c;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (&rhs[lVar12].m_backend,0);
      }
    }
    *(int *)eps2.m_backend.data._M_elems._40_8_ = j;
    idx = local_438;
    rn = j;
  }
  if ((double)(int)eps2.m_backend.data._M_elems[6] <= (double)local_418->thedim * 0.2) {
    piVar5 = (local_418->row).perm;
    j_2 = 0;
    for (lVar11 = 0; lVar11 < (int)eps2.m_backend.data._M_elems[6]; lVar11 = lVar11 + 1) {
      lVar12 = (long)*(int *)(eps2.m_backend.data._M_elems._16_8_ + lVar11 * 4);
      lVar10 = lVar12 * 0x50;
      _j_1 = *(ulong *)(eps2.m_backend.data._M_elems._8_8_ + lVar10);
      uStack_400 = ((ulong *)(eps2.m_backend.data._M_elems._8_8_ + lVar10))[1];
      puVar1 = (uint *)(eps2.m_backend.data._M_elems._8_8_ + 0x10 + lVar10);
      local_3f8 = *(uint (*) [2])puVar1;
      auStack_3f0 = *(uint (*) [2])(puVar1 + 2);
      puVar1 = (uint *)(eps2.m_backend.data._M_elems._8_8_ + 0x20 + lVar10);
      local_3e8 = *(uint (*) [2])puVar1;
      auStack_3e0 = *(uint (*) [2])(puVar1 + 2);
      puVar1 = (uint *)(eps2.m_backend.data._M_elems._8_8_ + 0x30 + lVar10);
      local_3d8 = *(uint (*) [2])puVar1;
      auStack_3d0 = *(uint (*) [2])(puVar1 + 2);
      local_3c8 = *(int *)(eps2.m_backend.data._M_elems._8_8_ + 0x40 + lVar10);
      local_3c4 = *(bool *)(eps2.m_backend.data._M_elems._8_8_ + 0x44 + lVar10);
      local_3c0 = *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + 0x48 + lVar10);
      _j = *(ulong *)eps2.m_backend.data._M_elems._0_8_;
      auStack_3a0 = *(uint (*) [2])(eps2.m_backend.data._M_elems._0_8_ + 8);
      local_398 = *(uint (*) [2])(eps2.m_backend.data._M_elems._0_8_ + 0x10);
      auStack_390 = *(uint (*) [2])(eps2.m_backend.data._M_elems._0_8_ + 0x18);
      local_388 = *(uint (*) [2])(eps2.m_backend.data._M_elems._0_8_ + 0x20);
      auStack_380 = *(uint (*) [2])(eps2.m_backend.data._M_elems._0_8_ + 0x28);
      local_378 = *(uint (*) [2])(eps2.m_backend.data._M_elems._0_8_ + 0x30);
      auStack_370 = *(uint (*) [2])(eps2.m_backend.data._M_elems._0_8_ + 0x38);
      local_368 = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x40);
      local_364 = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x44);
      local_360 = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x48);
      if ((fpclass_type)local_360 != cpp_dec_float_finite || j != 0) {
        local_364 = (bool)(local_364 ^ 1);
      }
      tVar9 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&j_1,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&j);
      if (tVar9) {
LAB_0031a540:
        enQueueMax((int *)eps2.m_backend.data._M_elems._16_8_,&j_2,piVar5[lVar12]);
      }
      else {
        tVar9 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&j_1,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)eps2.m_backend.data._M_elems._0_8_);
        if (tVar9) goto LAB_0031a540;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)(lVar10 + eps2.m_backend.data._M_elems._8_8_),0
                  );
      }
    }
    eps2.m_backend.data._M_elems[6] = j_2;
    idx = local_438;
  }
  else {
    *(int *)eps2.m_backend.data._M_elems._16_8_ = local_418->thedim + -1;
  }
  this_00 = local_418;
  vec_00 = local_440;
  pnVar7 = local_448;
  ridx_00 = eps2.m_backend.data._M_elems._16_8_;
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_448->m_backend).data._M_elems;
  local_128.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)((local_448->m_backend).data._M_elems + 2);
  local_128.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((local_448->m_backend).data._M_elems + 4);
  local_128.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((local_448->m_backend).data._M_elems + 6);
  local_128.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((local_448->m_backend).data._M_elems + 8);
  local_128.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)((local_448->m_backend).data._M_elems + 10);
  local_128.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)((local_448->m_backend).data._M_elems + 0xc);
  local_128.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)((local_448->m_backend).data._M_elems + 0xe);
  local_128.m_backend.exp = (local_448->m_backend).exp;
  local_128.m_backend.neg = (local_448->m_backend).neg;
  local_128.m_backend.fpclass = (local_448->m_backend).fpclass;
  local_128.m_backend.prec_elem = (local_448->m_backend).prec_elem;
  rn = vSolveUright(local_418,local_440,idx,rhs,local_428,rn,&local_128);
  uVar6 = eps2.m_backend.data._M_elems._0_8_;
  local_178.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_178.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_178.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_178.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_178.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_178.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_178.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  local_178.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x38);
  local_178.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x40);
  local_178.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x44);
  local_178.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x48);
  vSolveUrightNoNZ(this_00,vec2,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)eps2.m_backend.data._M_elems._8_8_,(int *)ridx_00,
                   eps2.m_backend.data._M_elems[6],&local_178);
  if ((this_00->l).updateType == 0) {
    local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar7->m_backend).data._M_elems;
    local_1c8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pnVar7->m_backend).data._M_elems + 2)
    ;
    local_1c8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((pnVar7->m_backend).data._M_elems + 4);
    local_1c8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((pnVar7->m_backend).data._M_elems + 6);
    local_1c8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((pnVar7->m_backend).data._M_elems + 8);
    local_1c8.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((pnVar7->m_backend).data._M_elems + 10);
    local_1c8.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((pnVar7->m_backend).data._M_elems + 0xc);
    local_1c8.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((pnVar7->m_backend).data._M_elems + 0xe);
    local_1c8.m_backend.exp = (pnVar7->m_backend).exp;
    local_1c8.m_backend.neg = (pnVar7->m_backend).neg;
    local_1c8.m_backend.fpclass = (pnVar7->m_backend).fpclass;
    local_1c8.m_backend.prec_elem = (pnVar7->m_backend).prec_elem;
    rn = vSolveUpdateRight(this_00,vec_00,idx,rn,&local_1c8);
    local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)uVar6;
    local_218.m_backend.data._M_elems._8_8_ = *(undefined8 *)(uVar6 + 8);
    local_218.m_backend.data._M_elems._16_8_ = *(undefined8 *)(uVar6 + 0x10);
    local_218.m_backend.data._M_elems._24_8_ = *(undefined8 *)(uVar6 + 0x18);
    local_218.m_backend.data._M_elems._32_8_ = *(undefined8 *)(uVar6 + 0x20);
    local_218.m_backend.data._M_elems._40_8_ = *(undefined8 *)(uVar6 + 0x28);
    local_218.m_backend.data._M_elems._48_8_ = *(undefined8 *)(uVar6 + 0x30);
    local_218.m_backend.data._M_elems._56_8_ = *(undefined8 *)(uVar6 + 0x38);
    local_218.m_backend.exp = *(int *)(uVar6 + 0x40);
    local_218.m_backend.neg = *(bool *)(uVar6 + 0x44);
    local_218.m_backend._72_8_ = *(undefined8 *)(uVar6 + 0x48);
    vSolveUpdateRightNoNZ(this_00,vec2,&local_218);
  }
  return rn;
}

Assistant:

int CLUFactor<R>::vSolveRight4update2(R eps,
                                      R* vec, int* idx,                  /* result1 */
                                      R* rhs, int* ridx, int rn,         /* rhs1    */
                                      R* vec2, R eps2,              /* result2 */
                                      R* rhs2, int* ridx2, int rn2,      /* rhs2    */
                                      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   if(rn2 > thedim * verySparseFactor4right)
   {
      ridx2[0] = thedim - 1;
      /* ridx2[1] = thedim - 2; */
   }
   else
   {
      R x;
      /*      R  maxabs; */
      int i, j, k;
      int* rperm;

      /*      maxabs = 1;    */
      rperm = row.perm;

      for(i = j = 0; i < rn2; ++i)
      {
         k = ridx2[i];
         assert(k >= 0 && k < thedim);
         x = rhs2[k];

         if(x < -eps2)
         {
            /*              maxabs = (maxabs < -x) ? -x : maxabs;  */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else if(x > eps2)
         {
            /*              maxabs = (maxabs < x) ? x : maxabs;    */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else
            rhs2[k] = 0;
      }

      rn2 = j;

      /*      eps2 = maxabs * eps2;  */
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   vSolveUrightNoNZ(vec2, rhs2, ridx2, rn2, eps2);

   /*
    *  rn = vSolveUright2(vec, idx, rhs, ridx, rn, eps, vec2, rhs2, ridx2, rn2, eps2);
    */

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      vSolveUpdateRightNoNZ(vec2, eps2);
   }

   return rn;
}